

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiling_info-c.cpp
# Opt level: O3

duckdb_profiling_info duckdb_get_profiling_info(duckdb_connection connection)

{
  optional_ptr<duckdb::ProfilingNode,_true> oVar1;
  
  if (connection == (duckdb_connection)0x0) {
    oVar1.ptr = (ProfilingNode *)0x0;
  }
  else {
    oVar1 = duckdb::Connection::GetProfilingTree((Connection *)connection);
  }
  return (duckdb_profiling_info)oVar1.ptr;
}

Assistant:

duckdb_profiling_info duckdb_get_profiling_info(duckdb_connection connection) {
	if (!connection) {
		return nullptr;
	}
	Connection *conn = reinterpret_cast<Connection *>(connection);
	optional_ptr<ProfilingNode> profiling_info;
	try {
		profiling_info = conn->GetProfilingTree();
	} catch (std::exception &ex) {
		return nullptr;
	}

	ProfilingNode *profiling_info_ptr = profiling_info.get();
	return reinterpret_cast<duckdb_profiling_info>(profiling_info_ptr);
}